

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O2

void __thiscall
cfd::Psbt::Psbt(Psbt *this,uint32_t psbt_version,uint32_t version,uint32_t lock_time)

{
  _Rb_tree_header *p_Var1;
  
  core::Psbt::Psbt(&this->super_Psbt,psbt_version,version,lock_time);
  (this->super_Psbt)._vptr_Psbt = (_func_int **)&PTR__Psbt_0064d630;
  p_Var1 = &(this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Psbt::Psbt(uint32_t psbt_version, uint32_t version, uint32_t lock_time)
    : cfd::core::Psbt(psbt_version, version, lock_time) {}